

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O0

ForRangeStmt * __thiscall parser::Parser::parseForIntRangeStatement(Parser *this)

{
  bool bVar1;
  Parser *this_00;
  ostream *poVar2;
  Identifier *this_01;
  RangeExpr *pRVar3;
  BlockStmt *pBVar4;
  value_type local_258;
  undefined1 local_231;
  Token local_230;
  undefined4 local_1fc;
  value_type local_1f8;
  ostringstream local_1d8 [8];
  ostringstream message;
  Token local_50;
  Parser *local_20;
  ForRangeStmt *stmt;
  Parser *this_local;
  
  stmt = (ForRangeStmt *)this;
  this_00 = (Parser *)operator_new(0x58);
  token::Token::Token(&local_50,&this->curToken);
  ast::ForRangeStmt::ForRangeStmt((ForRangeStmt *)this_00,&local_50,this->l->line);
  token::Token::~Token(&local_50);
  local_20 = this_00;
  std::__cxx11::ostringstream::ostringstream(local_1d8);
  bVar1 = expectPeek(this,ID);
  if (bVar1) {
    this_01 = (Identifier *)operator_new(0x48);
    local_231 = 1;
    token::Token::Token(&local_230,&this->curToken);
    ast::Identifier::Identifier(this_01,&local_230,this->l->line);
    local_231 = 0;
    *(Identifier **)
     ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)&local_20->peekToken + 1) = this_01;
    token::Token::~Token(&local_230);
    bVar1 = expectPeek(this,IN);
    if (bVar1) {
      pRVar3 = parseIntRangeExpression(this);
      *(RangeExpr **)((long)&local_20->peekToken + 0x18) = pRVar3;
      pBVar4 = parseBlockStatement(this);
      ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
        *)&local_20->peekToken)[2]._M_allocated_capacity = (size_type)pBVar4;
      nextToken(this);
      this_local = local_20;
    }
    else {
      poVar2 = std::operator<<((ostream *)local_1d8,"expected \'in\'");
      poVar2 = std::operator<<(poVar2," found ");
      std::operator<<(poVar2,(string *)&(this->peekToken).Literal);
      std::__cxx11::ostringstream::str();
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(&this->errors,&local_258);
      std::__cxx11::string::~string((string *)&local_258);
      if (local_20 != (Parser *)0x0) {
        (*((Node *)&(local_20->curToken)._vptr_Token)->_vptr_Node[1])();
      }
      this_local = (Parser *)0x0;
    }
  }
  else {
    poVar2 = std::operator<<((ostream *)local_1d8,"expected an identifier");
    poVar2 = std::operator<<(poVar2," found ");
    std::operator<<(poVar2,(string *)&(this->peekToken).Literal);
    std::__cxx11::ostringstream::str();
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(&this->errors,&local_1f8);
    std::__cxx11::string::~string((string *)&local_1f8);
    if (local_20 != (Parser *)0x0) {
      (*((Node *)&(local_20->curToken)._vptr_Token)->_vptr_Node[1])();
    }
    this_local = (Parser *)0x0;
  }
  local_1fc = 1;
  std::__cxx11::ostringstream::~ostringstream(local_1d8);
  return (ForRangeStmt *)this_local;
}

Assistant:

ForRangeStmt* Parser::parseForIntRangeStatement()
{
    ForRangeStmt* stmt(new ForRangeStmt(curToken, l->line));
    std::ostringstream message;
    if(!expectPeek(TokenType::ID)){
        message << "expected an identifier"
             << " found " << peekToken.Literal;
        errors.push_back(message.str());
        delete stmt;
        return nullptr;
    }

    stmt->target = new Identifier(curToken, l->line);
    if(!expectPeek(TokenType::IN)){
        message << "expected 'in'"
             << " found " << peekToken.Literal;
        errors.push_back(message.str());
        delete stmt;
        return nullptr;
    }
    stmt->iter = parseIntRangeExpression();
    stmt->body = parseBlockStatement();
    nextToken();
    return stmt;
}